

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

void __thiscall amrex::TagBox::TagBox(TagBox *this,Box *bx,int n,Arena *ar)

{
  BaseFab<char>::BaseFab(&this->super_BaseFab<char>,bx,n,ar);
  (this->super_BaseFab<char>)._vptr_BaseFab = (_func_int **)&PTR__BaseFab_007d48a8;
  return;
}

Assistant:

TagBox::TagBox (const Box& bx, int n, Arena* ar)
    : BaseFab<TagBox::TagType>(bx,n,ar)
{}